

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalaha.h
# Opt level: O3

void __thiscall KalahaState<(short)6>::do_move(KalahaState<(short)6> *this,Move move)

{
  short sVar1;
  short *psVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  short *psVar6;
  uint uVar7;
  short sVar8;
  short sVar9;
  long lVar10;
  ulong uVar11;
  
  if (this->player_must_pass == true) {
    if (move != -1) {
      MCTS::assertion_failed
                ("move == pass_move",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x25);
    }
    this->player_must_pass = false;
    iVar3 = this->player_to_move;
  }
  else {
    if (5 < (ushort)move) {
      MCTS::assertion_failed
                ("0 <= move && move < num_bins",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x2b);
    }
    iVar3 = this->player_to_move;
    psVar6 = this->player2_bins;
    psVar2 = this->player1_bins;
    if (iVar3 == 1) {
      psVar6 = this->player1_bins;
      psVar2 = this->player2_bins;
    }
    uVar7 = (uint)(ushort)psVar6[(ushort)move];
    if (psVar6[(ushort)move] < 1) {
      MCTS::assertion_failed
                ("lower_bins[move] > 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/PetterS[P]monte-carlo-tree-search/games/kalaha.h"
                 ,0x2e);
    }
    uVar5 = (ulong)(iVar3 != 1);
    psVar6[(ushort)move] = 0;
    do {
      if (move != 5) {
        sVar8 = (short)uVar7 + -1;
        lVar10 = 0;
        do {
          sVar1 = psVar6[(long)move + lVar10 + 1];
          psVar6[(long)move + lVar10 + 1] = sVar1 + 1;
          sVar9 = (short)lVar10;
          iVar4 = (int)lVar10;
          if ((sVar8 == sVar9) && (sVar1 == 0)) {
            uVar7 = (4 - iVar4) - (int)move;
            this->player2_bins[uVar5 + 6] = psVar2[uVar7] + this->player2_bins[uVar5 + 6] + 1;
            psVar6[(long)move + lVar10 + 1] = 0;
            psVar2[uVar7] = 0;
            goto LAB_0010b661;
          }
          lVar10 = lVar10 + 1;
        } while ((move + iVar4 < 4) && (sVar8 != sVar9));
        if ((short)uVar7 == (short)lVar10) break;
        uVar7 = (uVar7 & 0xffff) - (int)lVar10;
      }
      this->player2_bins[uVar5 + 6] = this->player2_bins[uVar5 + 6] + 1;
      if ((short)uVar7 == 1) {
        this->player_must_pass = true;
        break;
      }
      iVar4 = uVar7 - 2;
      if (4 < (ushort)iVar4) {
        iVar4 = 5;
      }
      uVar11 = 0;
      do {
        psVar2[uVar11] = psVar2[uVar11] + 1;
        uVar11 = uVar11 + 1;
      } while ((iVar4 + 1U & 0xffff) != uVar11);
      iVar4 = uVar7 - (int)uVar11;
      uVar7 = iVar4 - 1;
    } while (1 < (short)iVar4);
  }
LAB_0010b661:
  this->player_to_move = 3 - iVar3;
  return;
}

Assistant:

void do_move(Move move)
	{
		if (player_must_pass) {
			attest(move == pass_move);
			player_must_pass = false;
			player_to_move = 3 - player_to_move;
			return;
		}

		attest(0 <= move && move < num_bins);
		short* upper_bins = player_to_move == 1 ? player2_bins : player1_bins;
		short* lower_bins = player_to_move == 1 ? player1_bins : player2_bins;
		attest(lower_bins[move] > 0);
		auto seeds = lower_bins[move];
		lower_bins[move] = 0;

		short* lower_store = player_to_move == 1 ? &player1_store : &player2_store;

		while (seeds > 0) {
			// Move along lower bins.
			for (auto m = move + 1; m < num_bins && seeds > 0; ++m) {
				lower_bins[m] += 1;
				seeds -= 1;

				if (seeds == 0) {
					// Land in an empty square with opposite markers?
					auto opposite = num_bins - 1 - m;
					if (lower_bins[m] == 1 /* && upper_bins[opposite] > 0 */) { // Allow null capture?
						// Capture everything
						*lower_store += lower_bins[m] + upper_bins[opposite];
						lower_bins[m] = 0;
						upper_bins[opposite] = 0;
					}
				}
			}

			if (seeds == 0) {
				break;
			}

			// Put a seed in the store.
			*lower_store += 1;
			seeds -= 1;
			if (seeds == 0) {
				// Last seed in store; gets an extra turn.
				player_must_pass = true;
				break;
			}

			// Move along upper bins.
			for (short m = 0; m < num_bins && seeds > 0; ++m) {
				upper_bins[m] += 1;
				seeds -= 1;
			}
		}

		player_to_move = 3 - player_to_move;
	}